

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::deinit(DrawCallBatchingTest *this)

{
  ShaderProgram *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer pvVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_38;
  long lVar6;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_dynamicIndexData,&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_staticIndexData,&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  puVar1 = (this->m_unbatchedDynamicIndexBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_unbatchedDynamicIndexBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    (**(code **)(lVar6 + 0x438))((ulong)((long)puVar2 - (long)puVar1) >> 2);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x1fd);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_unbatchedDynamicIndexBuffers,&local_58);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  }
  if (this->m_batchedDynamicIndexBuffer != 0) {
    (**(code **)(lVar6 + 0x438))(1,&this->m_batchedDynamicIndexBuffer);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x205);
    this->m_batchedDynamicIndexBuffer = 0;
  }
  if (this->m_unbatchedStaticIndexBuffer != 0) {
    (**(code **)(lVar6 + 0x438))(1,&this->m_unbatchedStaticIndexBuffer);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x20d);
    this->m_unbatchedStaticIndexBuffer = 0;
  }
  if (this->m_batchedStaticIndexBuffer != 0) {
    (**(code **)(lVar6 + 0x438))(1,&this->m_batchedStaticIndexBuffer);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x215);
    this->m_batchedStaticIndexBuffer = 0;
  }
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::_M_move_assign(&this->m_staticAttributeDatas,&local_58);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector((vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
             *)&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::_M_move_assign(&this->m_dynamicAttributeDatas,&local_58);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector((vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
             *)&local_58);
  puVar1 = (this->m_batchedStaticBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_batchedStaticBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    (**(code **)(lVar6 + 0x438))((ulong)((long)puVar2 - (long)puVar1) >> 2);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x220);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_batchedStaticBuffers,&local_58);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  }
  puVar1 = (this->m_unbatchedStaticBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_unbatchedStaticBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    (**(code **)(lVar6 + 0x438))((ulong)((long)puVar2 - (long)puVar1) >> 2);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x228);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_unbatchedStaticBuffers,&local_58);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  }
  puVar1 = (this->m_batchedDynamicBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_batchedDynamicBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    (**(code **)(lVar6 + 0x438))((ulong)((long)puVar2 - (long)puVar1) >> 2);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x230);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_batchedDynamicBuffers,&local_58);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  }
  local_38 = &this->m_unbatchedDynamicBuffers;
  lVar8 = 8;
  lVar9 = 0;
  while( true ) {
    pvVar3 = (this->m_unbatchedDynamicBuffers).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(this->m_unbatchedDynamicBuffers).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
    if ((int)(lVar7 / 0x18) <= lVar9) break;
    (**(code **)(lVar6 + 0x438))
              ((ulong)(*(long *)((long)&(pvVar3->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar8) -
                      *(long *)((long)pvVar3 + lVar8 + -8)) >> 2);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x238);
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x18;
  }
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(local_38,&local_58,lVar7 % 0x18);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->m_unbatchedSamplesUs,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->m_batchedSamplesUs,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void DrawCallBatchingTest::deinit (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	delete m_program;
	m_program = NULL;

	m_dynamicIndexData	= vector<deUint8>();
	m_staticIndexData	= vector<deUint8>();

	if (!m_unbatchedDynamicIndexBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_unbatchedDynamicIndexBuffers.size(), &(m_unbatchedDynamicIndexBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedDynamicIndexBuffers = vector<GLuint>();
	}

	if (m_batchedDynamicIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_batchedDynamicIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedDynamicIndexBuffer = 0;
	}

	if (m_unbatchedStaticIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_unbatchedStaticIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedStaticIndexBuffer = 0;
	}

	if (m_batchedStaticIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_batchedStaticIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedStaticIndexBuffer = 0;
	}

	m_staticAttributeDatas	= vector<vector<deInt8> >();
	m_dynamicAttributeDatas	= vector<vector<deInt8> >();

	if (!m_batchedStaticBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_batchedStaticBuffers.size(), &(m_batchedStaticBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedStaticBuffers = vector<GLuint>();
	}

	if (!m_unbatchedStaticBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_unbatchedStaticBuffers.size(), &(m_unbatchedStaticBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedStaticBuffers = vector<GLuint>();
	}

	if (!m_batchedDynamicBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_batchedDynamicBuffers.size(), &(m_batchedDynamicBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedDynamicBuffers = vector<GLuint>();
	}

	for (int i = 0; i < (int)m_unbatchedDynamicBuffers.size(); i++)
	{
		gl.deleteBuffers((GLsizei)m_unbatchedDynamicBuffers[i].size(), &(m_unbatchedDynamicBuffers[i][0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");
	}

	m_unbatchedDynamicBuffers = vector<vector<GLuint> >();

	m_unbatchedSamplesUs	= vector<deUint64>();
	m_batchedSamplesUs		= vector<deUint64>();
}